

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
server_socket::server_socket
          (server_socket *this,epoll *ep,ipv4_endpoint param_2,on_connected_t *on_connected)

{
  on_connected_t *ep_00;
  int iVar1;
  anon_class_8_1_8991fb9c local_60;
  callback_t local_58;
  on_connected_t *local_28;
  on_connected_t *on_connected_local;
  epoll *ep_local;
  server_socket *this_local;
  ipv4_endpoint local_endpoint_local;
  
  local_28 = on_connected;
  on_connected_local = (on_connected_t *)ep;
  ep_local = (epoll *)this;
  this_local = (server_socket *)param_2;
  anon_unknown.dwarf_17db9::make_socket((anon_unknown_dwarf_17db9 *)this,2,0x801);
  std::function<void_()>::function(&this->on_connected,on_connected);
  ep_00 = on_connected_local;
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  local_60.this = this;
  std::function<void(unsigned_int)>::
  function<server_socket::server_socket(sysapi::epoll&,ipv4_endpoint,std::function<void()>)::__0,void>
            ((function<void(unsigned_int)> *)&local_58,&local_60);
  sysapi::epoll_registration::epoll_registration(&this->reg,(epoll *)ep_00,iVar1,1,&local_58);
  std::function<void_(unsigned_int)>::~function(&local_58);
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  anon_unknown.dwarf_17db9::bind_socket(iVar1,(uint16_t)this_local,this_local._4_4_);
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  anon_unknown.dwarf_17db9::start_listen(iVar1);
  return;
}

Assistant:

server_socket::server_socket(epoll& ep, ipv4_endpoint local_endpoint, on_connected_t on_connected)
    : fd(make_socket(AF_INET, SOCK_STREAM | SOCK_NONBLOCK))
    , on_connected(on_connected)
    , reg(ep, fd.getfd(), EPOLLIN, [this](uint32_t events) {
        assert(events == EPOLLIN);
        this->on_connected();
    })
{
    bind_socket(fd.getfd(), local_endpoint.port_net, local_endpoint.addr_net);
    start_listen(fd.getfd());
}